

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O0

void bench_sign_setup(void *arg)

{
  bench_data *data;
  int i;
  void *arg_local;
  
  for (i = 0; i < 0x20; i = i + 1) {
    *(char *)((long)arg + (long)i + 8) = (char)i + '\x01';
  }
  for (i = 0; i < 0x20; i = i + 1) {
    *(char *)((long)arg + (long)i + 0x28) = (char)i + 'A';
  }
  return;
}

Assistant:

static void bench_sign_setup(void* arg) {
    int i;
    bench_data *data = (bench_data*)arg;

    for (i = 0; i < 32; i++) {
        data->msg[i] = i + 1;
    }
    for (i = 0; i < 32; i++) {
        data->key[i] = i + 65;
    }
}